

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

ON_Interval __thiscall ON_RevSurface::Domain(ON_RevSurface *this,int dir)

{
  int iVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_Interval OVar2;
  ON_Interval local_28;
  
  ON_Interval::ON_Interval(&local_28);
  iVar1 = 1 - dir;
  if (this->m_bTransposed == false) {
    iVar1 = dir;
  }
  if (iVar1 == 1) {
    if (this->m_curve != (ON_Curve *)0x0) {
      (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
      local_28.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      local_28.m_t[1] = in_XMM1_Qa;
    }
  }
  else if (iVar1 == 0) {
    local_28.m_t[0] = (this->m_t).m_t[0];
    local_28.m_t[1] = (this->m_t).m_t[1];
  }
  OVar2.m_t[0] = local_28.m_t[0];
  OVar2.m_t[1] = local_28.m_t[1];
  return (ON_Interval)OVar2.m_t;
}

Assistant:

ON_Interval ON_RevSurface::Domain( int dir ) const
{
  ON_Interval d;
  if ( m_bTransposed )
    dir = 1-dir;
  if ( dir == 0 )
  {
    d = m_t;
  }
  else if ( dir == 1 && m_curve )
  {
    d = m_curve->Domain();
  }
  return d;
}